

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int setChildPtrmaps(MemPage *pPage)

{
  u8 uVar1;
  u8 uVar2;
  ushort uVar3;
  ushort uVar4;
  BtShared *pBt;
  u8 *puVar5;
  u32 uVar6;
  int iVar7;
  ulong uVar8;
  int rc;
  Pgno local_34;
  
  pBt = pPage->pBt;
  local_34 = pPage->pgno;
  if (pPage->isInit == '\0') {
    iVar7 = btreeInitPage(pPage);
    _rc = CONCAT44(local_34,iVar7);
    if (iVar7 != 0) {
      return iVar7;
    }
  }
  else {
    _rc = (ulong)local_34 << 0x20;
  }
  uVar3 = pPage->nCell;
  for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
    uVar4 = pPage->maskPage;
    uVar1 = pPage->aCellIdx[uVar8 * 2];
    uVar2 = pPage->aCellIdx[uVar8 * 2 + 1];
    puVar5 = pPage->aData;
    ptrmapPutOvflPtr(pPage,pPage,puVar5 + (CONCAT11(uVar1,uVar2) & uVar4),&rc);
    if (pPage->leaf == '\0') {
      uVar6 = sqlite3Get4byte(puVar5 + (CONCAT11(uVar1,uVar2) & uVar4));
      ptrmapPut(pBt,uVar6,'\x05',local_34,&rc);
    }
  }
  if (pPage->leaf == '\0') {
    uVar6 = sqlite3Get4byte(pPage->aData + (ulong)pPage->hdrOffset + 8);
    ptrmapPut(pBt,uVar6,'\x05',local_34,&rc);
  }
  return rc;
}

Assistant:

static int setChildPtrmaps(MemPage *pPage){
  int i;                             /* Counter variable */
  int nCell;                         /* Number of cells in page pPage */
  int rc;                            /* Return code */
  BtShared *pBt = pPage->pBt;
  Pgno pgno = pPage->pgno;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  rc = pPage->isInit ? SQLITE_OK : btreeInitPage(pPage);
  if( rc!=SQLITE_OK ) return rc;
  nCell = pPage->nCell;

  for(i=0; i<nCell; i++){
    u8 *pCell = findCell(pPage, i);

    ptrmapPutOvflPtr(pPage, pPage, pCell, &rc);

    if( !pPage->leaf ){
      Pgno childPgno = get4byte(pCell);
      ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
    }
  }

  if( !pPage->leaf ){
    Pgno childPgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
  }

  return rc;
}